

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::JsonUnitTestResultPrinter::OutputJsonTestResult
               (ostream *stream,TestResult *result)

{
  int iVar1;
  TestPartResult *pTVar2;
  ostream *poVar3;
  long *plVar4;
  long *in_RCX;
  int iVar5;
  internal *this;
  int i;
  undefined1 local_d8 [8];
  string message;
  long local_a8;
  long lStack_a0;
  size_type *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string location;
  string kIndent;
  
  location.field_2._8_8_ = &kIndent._M_string_length;
  kIndent.field_2._8_8_ = stream;
  std::__cxx11::string::_M_construct((ulong)((long)&location.field_2 + 8),'\n');
  if (0 < (int)((ulong)((long)(result->test_part_results_).
                              super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(result->test_part_results_).
                             super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x49249249) {
    iVar5 = 0;
    i = 0;
    do {
      pTVar2 = TestResult::GetTestPartResult(result,i);
      iVar1 = (int)in_RCX;
      if (pTVar2->type_ - kNonFatalFailure < 2) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)kIndent.field_2._8_8_,",\n",2)
        ;
        if (iVar5 == 0) {
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)kIndent.field_2._8_8_,(char *)location.field_2._8_8_,
                              (long)kIndent._M_dataplus._M_p);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"failures",8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\": [\n",5);
        }
        this = (internal *)(pTVar2->file_name_)._M_string_length;
        if (this != (internal *)0x0) {
          this = (internal *)(pTVar2->file_name_)._M_dataplus._M_p;
        }
        FormatCompilerIndependentFileLocation_abi_cxx11_
                  ((string *)((long)&__str.field_2 + 8),this,
                   (char *)(ulong)(uint)pTVar2->line_number_,iVar1);
        local_98 = &__str._M_string_length;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,__str.field_2._8_8_,
                   location._M_dataplus._M_p + __str.field_2._8_8_);
        std::__cxx11::string::append((char *)&local_98);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_98);
        message.field_2._8_8_ = &stack0xffffffffffffff58;
        in_RCX = plVar4 + 2;
        if ((long *)*plVar4 == in_RCX) {
          local_a8 = *in_RCX;
          lStack_a0 = plVar4[3];
        }
        else {
          local_a8 = *in_RCX;
          message.field_2._8_8_ = (long *)*plVar4;
        }
        *plVar4 = (long)in_RCX;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        EscapeJson((string *)local_d8,(string *)((long)&message.field_2 + 8));
        if ((long *)message.field_2._8_8_ != &stack0xffffffffffffff58) {
          operator_delete((void *)message.field_2._8_8_,local_a8 + 1);
        }
        if (local_98 != &__str._M_string_length) {
          operator_delete(local_98,__str._M_string_length + 1);
        }
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)kIndent.field_2._8_8_,(char *)location.field_2._8_8_,
                            (long)kIndent._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  {\n",4);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(char *)location.field_2._8_8_,(long)kIndent._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    \"failure\": \"",0x10);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(char *)local_d8,(long)message._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\",\n",3);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(char *)location.field_2._8_8_,(long)kIndent._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    \"type\": \"\"\n",0xf);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(char *)location.field_2._8_8_,(long)kIndent._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  }",3);
        if (local_d8 != (undefined1  [8])&message._M_string_length) {
          operator_delete((void *)local_d8,message._M_string_length + 1);
        }
        if ((size_type *)__str.field_2._8_8_ != &location._M_string_length) {
          operator_delete((void *)__str.field_2._8_8_,location._M_string_length + 1);
        }
        iVar5 = iVar5 + 1;
      }
      i = i + 1;
      iVar1 = (int)((ulong)((long)(result->test_part_results_).
                                  super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(result->test_part_results_).
                                 super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4);
    } while (SBORROW4(i,iVar1 * -0x49249249) != i + iVar1 * 0x49249249 < 0);
    if (0 < iVar5) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)kIndent.field_2._8_8_,"\n",1);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)kIndent.field_2._8_8_,(char *)location.field_2._8_8_,
                          (long)kIndent._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)kIndent.field_2._8_8_,"\n",1);
  __str.field_2._8_8_ = &location._M_string_length;
  std::__cxx11::string::_M_construct((ulong)((long)&__str.field_2 + 8),'\b');
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)kIndent.field_2._8_8_,(char *)__str.field_2._8_8_,
                      (long)location._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}",1);
  if ((size_type *)__str.field_2._8_8_ != &location._M_string_length) {
    operator_delete((void *)__str.field_2._8_8_,location._M_string_length + 1);
  }
  if ((size_type *)location.field_2._8_8_ != &kIndent._M_string_length) {
    operator_delete((void *)location.field_2._8_8_,kIndent._M_string_length + 1);
  }
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OutputJsonTestResult(::std::ostream* stream,
                                                     const TestResult& result) {
  const std::string kIndent = Indent(10);

  int failures = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      *stream << ",\n";
      if (++failures == 1) {
        *stream << kIndent << "\"" << "failures" << "\": [\n";
      }
      const std::string location =
          internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                          part.line_number());
      const std::string message = EscapeJson(location + "\n" + part.message());
      *stream << kIndent << "  {\n"
              << kIndent << "    \"failure\": \"" << message << "\",\n"
              << kIndent << "    \"type\": \"\"\n"
              << kIndent << "  }";
    }
  }

  if (failures > 0)
    *stream << "\n" << kIndent << "]";
  *stream << "\n" << Indent(8) << "}";
}